

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int parse_codes(archive_read *a)

{
  rar_br *br;
  CPpmd7 *p;
  undefined1 uVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Bool BVar6;
  int iVar7;
  void *__s;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  char *fmt;
  int iVar12;
  char in_R8B;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  huffman_code precode;
  uchar bitlengths [20];
  huffman_code local_78;
  byte local_48 [24];
  
  pvVar2 = a->format->data;
  br = (rar_br *)((long)pvVar2 + 0x4ef0);
  free_codes(a);
  uVar4 = *(uint *)((long)pvVar2 + 0x4ef8) & 0xfffffff8;
  *(uint *)((long)pvVar2 + 0x4ef8) = uVar4;
  if ((((int)uVar4 < 1) && (iVar5 = rar_br_fillup(a,br), iVar5 == 0)) &&
     (*(int *)((long)pvVar2 + 0x4ef8) < 1)) {
LAB_0015f189:
    archive_set_error(&a->archive,0x54,"Truncated RAR file data");
    *(undefined1 *)((long)pvVar2 + 0xd0) = 0;
    return -0x1e;
  }
  iVar5 = *(int *)((long)pvVar2 + 0x4ef8);
  uVar10 = *(ulong *)((long)pvVar2 + 0x4ef0) >> ((byte)(iVar5 + -1) & 0x3f);
  *(byte *)((long)pvVar2 + 0x393) = (byte)uVar10 & 1;
  *(int *)((long)pvVar2 + 0x4ef8) = iVar5 + -1;
  if ((uVar10 & 1) == 0) {
    if (((1 < iVar5) || (iVar5 = rar_br_fillup(a,br), iVar5 != 0)) ||
       (0 < *(int *)((long)pvVar2 + 0x4ef8))) {
      uVar4 = *(int *)((long)pvVar2 + 0x4ef8) - 1;
      if ((*(ulong *)((long)pvVar2 + 0x4ef0) >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        memset((void *)((long)pvVar2 + 0x1b0),0,0x194);
      }
      *(uint *)((long)pvVar2 + 0x4ef8) = uVar4;
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      local_48[4] = 0;
      local_48[5] = 0;
      local_48[6] = 0;
      local_48[7] = 0;
      local_48[8] = 0;
      local_48[9] = 0;
      local_48[10] = 0;
      local_48[0xb] = 0;
      local_48[0xc] = 0;
      local_48[0xd] = 0;
      local_48[0xe] = 0;
      local_48[0xf] = 0;
      local_48[0x10] = 0;
      local_48[0x11] = 0;
      local_48[0x12] = 0;
      local_48[0x13] = 0;
      uVar4 = 0;
      do {
        if (((*(int *)((long)pvVar2 + 0x4ef8) < 4) && (iVar5 = rar_br_fillup(a,br), iVar5 == 0)) &&
           (*(int *)((long)pvVar2 + 0x4ef8) < 4)) goto LAB_0015f189;
        iVar15 = *(int *)((long)pvVar2 + 0x4ef8);
        iVar5 = iVar15 + -4;
        bVar9 = (byte)(*(ulong *)((long)pvVar2 + 0x4ef0) >> ((byte)iVar5 & 0x3f)) & 0xf;
        uVar10 = (ulong)(uVar4 + 1);
        uVar14 = (ulong)(int)uVar4;
        local_48[uVar14] = bVar9;
        *(int *)((long)pvVar2 + 0x4ef8) = iVar5;
        if (bVar9 == 0xf) {
          if (((iVar15 < 8) && (iVar5 = rar_br_fillup(a,br), iVar5 == 0)) &&
             (*(int *)((long)pvVar2 + 0x4ef8) < 4)) goto LAB_0015f189;
          iVar5 = *(int *)((long)pvVar2 + 0x4ef8) + -4;
          uVar11 = *(ulong *)((long)pvVar2 + 0x4ef0) >> ((byte)iVar5 & 0x3f);
          *(int *)((long)pvVar2 + 0x4ef8) = iVar5;
          if ((uVar11 & 0xf) != 0) {
            if ((int)uVar4 < 0x14) {
              uVar10 = (ulong)((uint)uVar11 & 0xf) + 1;
              if (0x13 - uVar4 <= uVar10) {
                uVar10 = (ulong)(0x13 - uVar4);
              }
              memset(local_48 + uVar14,0,uVar10 + 1);
              uVar4 = 1;
              do {
                uVar10 = uVar14 + 1;
                if ((byte)(((byte)uVar11 & 0xf) + 2) <= uVar4) break;
                uVar4 = uVar4 + 1;
                bVar3 = (long)uVar14 < 0x13;
                uVar14 = uVar10;
              } while (bVar3);
            }
            else {
              uVar10 = (ulong)uVar4;
            }
          }
        }
        uVar4 = (uint)uVar10;
      } while ((int)uVar4 < 0x14);
      local_78.minlength = 0;
      local_78.maxlength = 0;
      local_78.tablesize = 0;
      local_78._28_4_ = 0;
      local_78.tree = (huffman_tree_node *)0x0;
      local_78.numentries = 0;
      local_78.numallocatedentries = 0;
      local_78.table = (huffman_table_entry *)0x0;
      iVar5 = create_code(a,&local_78,local_48,0x14,in_R8B);
      if (iVar5 != 0) {
        free(local_78.tree);
        free(local_78.table);
        return iVar5;
      }
      uVar10 = 0;
      do {
        iVar5 = read_next_symbol(a,&local_78);
        if (iVar5 < 0) {
          free(local_78.tree);
          free(local_78.table);
          return -0x1e;
        }
        iVar15 = (int)uVar10;
        if (iVar5 < 0x10) {
          *(byte *)((long)pvVar2 + (long)iVar15 + 0x1b0) =
               (char)iVar5 + *(char *)((long)pvVar2 + (long)iVar15 + 0x1b0) & 0xf;
          uVar10 = (ulong)(iVar15 + 1);
        }
        else {
          if (0x11 < iVar5) {
            if (iVar5 == 0x12) {
              iVar5 = 3;
              uVar4 = 7;
              iVar12 = -3;
              if (((2 < *(int *)((long)pvVar2 + 0x4ef8)) ||
                  (iVar7 = rar_br_fillup(a,br), iVar7 != 0)) ||
                 (2 < *(int *)((long)pvVar2 + 0x4ef8))) {
LAB_0015eded:
                iVar12 = iVar12 + *(int *)((long)pvVar2 + 0x4ef8);
                *(int *)((long)pvVar2 + 0x4ef8) = iVar12;
                if (iVar15 < 0x194) {
                  uVar13 = (uVar4 & (uint)(*(ulong *)((long)pvVar2 + 0x4ef0) >>
                                          ((byte)iVar12 & 0x3f))) + iVar5;
                  uVar4 = uVar13 - 1;
                  uVar8 = 0x193U - iVar15;
                  if (uVar4 < 0x193U - iVar15) {
                    uVar8 = uVar4;
                  }
                  memset((uchar *)((long)pvVar2 + 0x1b0) + iVar15,0,(ulong)uVar8 + 1);
                  uVar4 = 1;
                  uVar14 = (long)iVar15;
                  do {
                    uVar10 = uVar14 + 1;
                    if (uVar13 <= uVar4) break;
                    uVar4 = uVar4 + 1;
                    bVar3 = (long)uVar14 < 0x193;
                    uVar14 = uVar10;
                  } while (bVar3);
                }
                goto LAB_0015ef00;
              }
            }
            else {
              iVar5 = 0xb;
              uVar4 = 0x7f;
              iVar12 = -7;
              if (((6 < *(int *)((long)pvVar2 + 0x4ef8)) ||
                  (iVar7 = rar_br_fillup(a,br), iVar7 != 0)) ||
                 (6 < *(int *)((long)pvVar2 + 0x4ef8))) goto LAB_0015eded;
            }
LAB_0015f175:
            free(local_78.tree);
            free(local_78.table);
            goto LAB_0015f189;
          }
          if (iVar15 == 0) {
            free(local_78.tree);
            free(local_78.table);
            fmt = "Internal error extracting RAR file.";
            goto LAB_0015f0f5;
          }
          if (iVar5 == 0x10) {
            iVar5 = 3;
            uVar4 = 7;
            iVar12 = -3;
            if (((*(int *)((long)pvVar2 + 0x4ef8) < 3) && (iVar7 = rar_br_fillup(a,br), iVar7 == 0))
               && (*(int *)((long)pvVar2 + 0x4ef8) < 3)) goto LAB_0015f175;
          }
          else {
            iVar5 = 0xb;
            uVar4 = 0x7f;
            iVar12 = -7;
            if (((*(int *)((long)pvVar2 + 0x4ef8) < 7) && (iVar7 = rar_br_fillup(a,br), iVar7 == 0))
               && (*(int *)((long)pvVar2 + 0x4ef8) < 7)) goto LAB_0015f175;
          }
          uVar14 = *(ulong *)((long)pvVar2 + 0x4ef0);
          iVar12 = iVar12 + *(int *)((long)pvVar2 + 0x4ef8);
          *(int *)((long)pvVar2 + 0x4ef8) = iVar12;
          if (iVar15 < 0x194) {
            uVar1 = *(undefined1 *)((long)pvVar2 + (long)iVar15 + 0x1afU);
            uVar8 = 1;
            uVar11 = (long)iVar15;
            do {
              *(undefined1 *)((long)pvVar2 + uVar11 + 0x1b0) = uVar1;
              uVar10 = uVar11 + 1;
              if ((uVar4 & (uint)(uVar14 >> ((byte)iVar12 & 0x3f))) + iVar5 <= uVar8) break;
              uVar8 = uVar8 + 1;
              bVar3 = (long)uVar11 < 0x193;
              uVar11 = uVar10;
            } while (bVar3);
          }
        }
LAB_0015ef00:
      } while ((int)uVar10 < 0x194);
      free(local_78.tree);
      free(local_78.table);
      iVar5 = create_code(a,(huffman_code *)((long)pvVar2 + 0x110),(uchar *)((long)pvVar2 + 0x1b0),
                          299,in_R8B);
      if (iVar5 != 0) {
        return iVar5;
      }
      iVar5 = create_code(a,(huffman_code *)((long)pvVar2 + 0x138),(uchar *)((long)pvVar2 + 0x2db),
                          0x3c,in_R8B);
      if (iVar5 != 0) {
        return iVar5;
      }
      iVar5 = create_code(a,(huffman_code *)((long)pvVar2 + 0x160),(uchar *)((long)pvVar2 + 0x317),
                          0x11,in_R8B);
      if (iVar5 != 0) {
        return iVar5;
      }
      iVar5 = create_code(a,(huffman_code *)((long)pvVar2 + 0x188),(uchar *)((long)pvVar2 + 0x328),
                          0x1c,in_R8B);
      if (iVar5 != 0) {
        return iVar5;
      }
LAB_0015f043:
      if ((*(int *)((long)pvVar2 + 0xe8) == 0) || (*(long *)((long)pvVar2 + 0x348) == 0)) {
        uVar10 = *(ulong *)((long)pvVar2 + 0x28);
        uVar4 = 0x400000;
        if ((long)uVar10 < 0x400000) {
          uVar4 = (uint)(uVar10 >> 1) & 0x7fffffff | (uint)uVar10;
          uVar4 = uVar4 >> 2 | uVar4;
          uVar4 = uVar4 >> 4 | uVar4;
          uVar4 = uVar4 >> 8 | uVar4;
          uVar4 = uVar4 >> 0x10 | uVar4;
          uVar4 = (uVar4 - (uVar4 >> 1)) * 2;
        }
        __s = realloc(*(void **)((long)pvVar2 + 0x348),(ulong)uVar4);
        if (__s == (void *)0x0) {
          archive_set_error(&a->archive,0xc,"Unable to allocate memory for uncompressed data.");
          return -0x1e;
        }
        *(void **)((long)pvVar2 + 0x348) = __s;
        *(uint *)((long)pvVar2 + 0xe8) = uVar4;
        memset(__s,0,(ulong)uVar4);
        *(int *)((long)pvVar2 + 0x350) = *(int *)((long)pvVar2 + 0xe8) + -1;
      }
      *(undefined1 *)((long)pvVar2 + 0x390) = 0;
      return 0;
    }
    goto LAB_0015f189;
  }
  if (((iVar5 < 8) && (iVar5 = rar_br_fillup(a,br), iVar5 == 0)) &&
     (*(int *)((long)pvVar2 + 0x4ef8) < 7)) goto LAB_0015f189;
  iVar15 = *(int *)((long)pvVar2 + 0x4ef8);
  iVar5 = iVar15 + -7;
  uVar10 = *(ulong *)((long)pvVar2 + 0x4ef0) >> ((byte)iVar5 & 0x3f);
  *(int *)((long)pvVar2 + 0x4ef8) = iVar5;
  if ((uVar10 & 0x20) != 0) {
    if (((iVar15 < 0xf) && (iVar5 = rar_br_fillup(a,br), iVar5 == 0)) &&
       (*(int *)((long)pvVar2 + 0x4ef8) < 8)) goto LAB_0015f189;
    iVar5 = *(int *)((long)pvVar2 + 0x4ef8) + -8;
    *(uint *)((long)pvVar2 + 0xe8) =
         ((uint)(*(ulong *)((long)pvVar2 + 0x4ef0) >> ((byte)iVar5 & 0x3f)) & 0xff) * 0x100000 +
         0x100000;
    *(int *)((long)pvVar2 + 0x4ef8) = iVar5;
  }
  if ((uVar10 & 0x40) == 0) {
    *(undefined4 *)((long)pvVar2 + 0x394) = 2;
  }
  else {
    if (((*(int *)((long)pvVar2 + 0x4ef8) < 8) && (iVar5 = rar_br_fillup(a,br), iVar5 == 0)) &&
       (*(int *)((long)pvVar2 + 0x4ef8) < 8)) goto LAB_0015f189;
    iVar5 = *(int *)((long)pvVar2 + 0x4ef8) + -8;
    uVar4 = (uint)(*(ulong *)((long)pvVar2 + 0x4ef0) >> ((byte)iVar5 & 0x3f)) & 0xff;
    *(uint *)((long)pvVar2 + 0x3b4) = uVar4;
    *(uint *)((long)pvVar2 + 0x394) = uVar4;
    *(int *)((long)pvVar2 + 0x4ef8) = iVar5;
  }
  if ((uVar10 & 0x20) == 0) {
    if (*(char *)((long)pvVar2 + 0x391) == '\0') {
      fmt = "Invalid PPMd sequence";
    }
    else {
      BVar6 = PpmdRAR_RangeDec_Init((CPpmd7z_RangeDec *)((long)pvVar2 + 0x4e88));
      if (BVar6 != 0) goto LAB_0015f043;
LAB_0015f0ea:
      fmt = "Unable to initialize PPMd range decoder";
    }
  }
  else {
    uVar8 = (uint)uVar10 & 0x1f;
    uVar4 = uVar8 * 3 - 0x1d;
    if (uVar8 < 0x10) {
      uVar4 = uVar8 + 1;
    }
    if (uVar4 != 1) {
      p = (CPpmd7 *)((long)pvVar2 + 0x398);
      Ppmd7_Free(p,&g_szalloc);
      *(archive_read **)((long)pvVar2 + 0x4eb8) = a;
      *(code **)((long)pvVar2 + 0x4ec0) = ppmd_read;
      PpmdRAR_RangeDec_CreateVTable((CPpmd7z_RangeDec *)((long)pvVar2 + 0x4e88));
      *(long *)((long)pvVar2 + 0x4eb0) = (long)pvVar2 + 0x4eb8;
      Ppmd7_Construct(p);
      BVar6 = Ppmd7_Alloc(p,*(UInt32 *)((long)pvVar2 + 0xe8),&g_szalloc);
      if (BVar6 == 0) {
        fmt = "Out of memory";
        iVar5 = 0xc;
        goto LAB_0015f0fa;
      }
      BVar6 = PpmdRAR_RangeDec_Init((CPpmd7z_RangeDec *)((long)pvVar2 + 0x4e88));
      if (BVar6 != 0) {
        Ppmd7_Init(p,uVar4);
        *(undefined1 *)((long)pvVar2 + 0x391) = 1;
        goto LAB_0015f043;
      }
      goto LAB_0015f0ea;
    }
    fmt = "Truncated RAR file data";
  }
LAB_0015f0f5:
  iVar5 = 0x54;
LAB_0015f0fa:
  archive_set_error(&a->archive,iVar5,fmt);
  return -0x1e;
}

Assistant:

static int
parse_codes(struct archive_read *a)
{
  int i, j, val, n, r;
  unsigned char bitlengths[MAX_SYMBOLS], zerocount, ppmd_flags;
  unsigned int maxorder;
  struct huffman_code precode;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  free_codes(a);

  /* Skip to the next byte */
  rar_br_consume_unalined_bits(br);

  /* PPMd block flag */
  if (!rar_br_read_ahead(a, br, 1))
    goto truncated_data;
  if ((rar->is_ppmd_block = rar_br_bits(br, 1)) != 0)
  {
    rar_br_consume(br, 1);
    if (!rar_br_read_ahead(a, br, 7))
      goto truncated_data;
    ppmd_flags = rar_br_bits(br, 7);
    rar_br_consume(br, 7);

    /* Memory is allocated in MB */
    if (ppmd_flags & 0x20)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->dictionary_size = (rar_br_bits(br, 8) + 1) << 20;
      rar_br_consume(br, 8);
    }

    if (ppmd_flags & 0x40)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->ppmd_escape = rar->ppmd7_context.InitEsc = rar_br_bits(br, 8);
      rar_br_consume(br, 8);
    }
    else
      rar->ppmd_escape = 2;

    if (ppmd_flags & 0x20)
    {
      maxorder = (ppmd_flags & 0x1F) + 1;
      if(maxorder > 16)
        maxorder = 16 + (maxorder - 16) * 3;

      if (maxorder == 1)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Truncated RAR file data");
        return (ARCHIVE_FATAL);
      }

      /* Make sure ppmd7_contest is freed before Ppmd7_Construct
       * because reading a broken file cause this abnormal sequence. */
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);

      rar->bytein.a = a;
      rar->bytein.Read = &ppmd_read;
      __archive_ppmd7_functions.PpmdRAR_RangeDec_CreateVTable(&rar->range_dec);
      rar->range_dec.Stream = &rar->bytein;
      __archive_ppmd7_functions.Ppmd7_Construct(&rar->ppmd7_context);

      if (!__archive_ppmd7_functions.Ppmd7_Alloc(&rar->ppmd7_context,
        rar->dictionary_size, &g_szalloc))
      {
        archive_set_error(&a->archive, ENOMEM,
                          "Out of memory");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
      __archive_ppmd7_functions.Ppmd7_Init(&rar->ppmd7_context, maxorder);
      rar->ppmd_valid = 1;
    }
    else
    {
      if (!rar->ppmd_valid) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid PPMd sequence");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
    }
  }
  else
  {
    rar_br_consume(br, 1);

    /* Keep existing table flag */
    if (!rar_br_read_ahead(a, br, 1))
      goto truncated_data;
    if (!rar_br_bits(br, 1))
      memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
    rar_br_consume(br, 1);

    memset(&bitlengths, 0, sizeof(bitlengths));
    for (i = 0; i < MAX_SYMBOLS;)
    {
      if (!rar_br_read_ahead(a, br, 4))
        goto truncated_data;
      bitlengths[i++] = rar_br_bits(br, 4);
      rar_br_consume(br, 4);
      if (bitlengths[i-1] == 0xF)
      {
        if (!rar_br_read_ahead(a, br, 4))
          goto truncated_data;
        zerocount = rar_br_bits(br, 4);
        rar_br_consume(br, 4);
        if (zerocount)
        {
          i--;
          for (j = 0; j < zerocount + 2 && i < MAX_SYMBOLS; j++)
            bitlengths[i++] = 0;
        }
      }
    }

    memset(&precode, 0, sizeof(precode));
    r = create_code(a, &precode, bitlengths, MAX_SYMBOLS, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK) {
      free(precode.tree);
      free(precode.table);
      return (r);
    }

    for (i = 0; i < HUFFMAN_TABLE_SIZE;)
    {
      if ((val = read_next_symbol(a, &precode)) < 0) {
        free(precode.tree);
        free(precode.table);
        return (ARCHIVE_FATAL);
      }
      if (val < 16)
      {
        rar->lengthtable[i] = (rar->lengthtable[i] + val) & 0xF;
        i++;
      }
      else if (val < 18)
      {
        if (i == 0)
        {
          free(precode.tree);
          free(precode.table);
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file.");
          return (ARCHIVE_FATAL);
        }

        if(val == 16) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for (j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
        {
          rar->lengthtable[i] = rar->lengthtable[i-1];
          i++;
        }
      }
      else
      {
        if(val == 18) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for(j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
          rar->lengthtable[i++] = 0;
      }
    }
    free(precode.tree);
    free(precode.table);

    r = create_code(a, &rar->maincode, &rar->lengthtable[0], MAINCODE_SIZE,
                MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->offsetcode, &rar->lengthtable[MAINCODE_SIZE],
                OFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lowoffsetcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE],
                LOWOFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lengthcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE +
                LOWOFFSETCODE_SIZE], LENGTHCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
  }

  if (!rar->dictionary_size || !rar->lzss.window)
  {
    /* Seems as though dictionary sizes are not used. Even so, minimize
     * memory usage as much as possible.
     */
    void *new_window;
    unsigned int new_size;

    if (rar->unp_size >= DICTIONARY_MAX_SIZE)
      new_size = DICTIONARY_MAX_SIZE;
    else
      new_size = rar_fls((unsigned int)rar->unp_size) << 1;
    new_window = realloc(rar->lzss.window, new_size);
    if (new_window == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
    rar->lzss.window = (unsigned char *)new_window;
    rar->dictionary_size = new_size;
    memset(rar->lzss.window, 0, rar->dictionary_size);
    rar->lzss.mask = rar->dictionary_size - 1;
  }

  rar->start_new_table = 0;
  return (ARCHIVE_OK);
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
}